

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O3

void __thiscall
helics::HandleManager::addAlias(HandleManager *this,string_view interfaceName,string_view alias)

{
  string_view *psVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  _Var5;
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  _Var6;
  mapped_type *pmVar7;
  basic_string_view<char,_std::char_traits<char>_> *interfaceAlias;
  string_view *psVar8;
  size_type __rlen;
  string_view sVar9;
  string_view interfaceName_00;
  string_view interfaceName_01;
  string_view interfaceName_02;
  string_view interfaceName_03;
  string_view interfaceName_04;
  string_view interfaceName_05;
  string_view interfaceName_06;
  string_view interfaceName_07;
  string_view interfaceName_08;
  string_view alias_00;
  string_view alias_01;
  string_view alias_02;
  string_view alias_03;
  string_view alias_04;
  string_view alias_05;
  string_view alias_06;
  string_view alias_07;
  string_view alias_08;
  string_view alias_09;
  string_view alias_10;
  string_view alias_11;
  string_view alias_12;
  string_view alias_13;
  string_view alias_14;
  string_view alias_15;
  string_view alias_16;
  string_view alias_17;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar10;
  key_type local_50;
  size_t local_40;
  char *local_38;
  
  local_38 = interfaceName._M_str;
  local_40 = interfaceName._M_len;
  pVar10 = std::
           _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
           ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>&>
                     ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                       *)&this->alias_names);
  _Var5 = pVar10.first.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur;
  pVar10 = std::
           _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
           ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>&>
                     ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                       *)&this->alias_names,&local_40,pVar10._8_8_);
  _Var6 = pVar10.first.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur;
  sVar9._M_str = *(char **)((long)_Var6.
                                  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  ._M_cur + 8);
  sVar9._M_len = *(size_t *)
                  ((long)_Var6.
                         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         ._M_cur + 0x10);
  alias_00._M_str =
       *(char **)((long)_Var5.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_00._M_len =
       *(size_t *)
        ((long)_Var5.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  bVar3 = addAliasName(this,sVar9,alias_00);
  if (bVar3) {
    local_50._M_str =
         *(char **)((long)_Var6.
                          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          ._M_cur + 8);
    local_50._M_len =
         *(size_t *)
          ((long)_Var6.
                 super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ._M_cur + 0x10);
    pmVar7 = std::__detail::
             _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->aliases,&local_50);
    psVar1 = (pmVar7->
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar8 = (pmVar7->
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar1; psVar8 = psVar8 + 1)
    {
      sVar2 = psVar8->_M_len;
      sVar9 = *psVar8;
      if ((sVar2 != alias._M_len) ||
         ((sVar2 != 0 && (iVar4 = bcmp(psVar8->_M_str,alias._M_str,sVar2), iVar4 != 0)))) {
        alias_01._M_str =
             *(char **)((long)_Var6.
                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ._M_cur + 8);
        alias_01._M_len =
             *(size_t *)
              ((long)_Var6.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur + 0x10);
        addPublicationAlias(this,sVar9,alias_01);
        alias_02._M_str =
             *(char **)((long)_Var6.
                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ._M_cur + 8);
        alias_02._M_len =
             *(size_t *)
              ((long)_Var6.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur + 0x10);
        addInputAlias(this,*psVar8,alias_02);
        alias_03._M_str =
             *(char **)((long)_Var6.
                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ._M_cur + 8);
        alias_03._M_len =
             *(size_t *)
              ((long)_Var6.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur + 0x10);
        addEndpointAlias(this,*psVar8,alias_03);
        alias_04._M_str =
             *(char **)((long)_Var6.
                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ._M_cur + 8);
        alias_04._M_len =
             *(size_t *)
              ((long)_Var6.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur + 0x10);
        addFilterAlias(this,*psVar8,alias_04);
      }
    }
  }
  interfaceName_00._M_str =
       *(char **)((long)_Var6.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_00._M_len =
       *(size_t *)
        ((long)_Var6.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_05._M_str =
       *(char **)((long)_Var5.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_05._M_len =
       *(size_t *)
        ((long)_Var5.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  addPublicationAlias(this,interfaceName_00,alias_05);
  interfaceName_01._M_str =
       *(char **)((long)_Var6.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_01._M_len =
       *(size_t *)
        ((long)_Var6.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_06._M_str =
       *(char **)((long)_Var5.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_06._M_len =
       *(size_t *)
        ((long)_Var5.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  addInputAlias(this,interfaceName_01,alias_06);
  interfaceName_02._M_str =
       *(char **)((long)_Var6.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_02._M_len =
       *(size_t *)
        ((long)_Var6.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_07._M_str =
       *(char **)((long)_Var5.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_07._M_len =
       *(size_t *)
        ((long)_Var5.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  addEndpointAlias(this,interfaceName_02,alias_07);
  interfaceName_03._M_str =
       *(char **)((long)_Var6.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_03._M_len =
       *(size_t *)
        ((long)_Var6.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_08._M_str =
       *(char **)((long)_Var5.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_08._M_len =
       *(size_t *)
        ((long)_Var5.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  addFilterAlias(this,interfaceName_03,alias_08);
  interfaceName_04._M_str =
       *(char **)((long)_Var5.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_04._M_len =
       *(size_t *)
        ((long)_Var5.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_09._M_str =
       *(char **)((long)_Var6.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_09._M_len =
       *(size_t *)
        ((long)_Var6.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  bVar3 = addAliasName(this,interfaceName_04,alias_09);
  if (bVar3) {
    local_50._M_str =
         *(char **)((long)_Var5.
                          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          ._M_cur + 8);
    local_50._M_len =
         *(size_t *)
          ((long)_Var5.
                 super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ._M_cur + 0x10);
    pmVar7 = std::__detail::
             _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->aliases,&local_50);
    psVar1 = (pmVar7->
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar8 = (pmVar7->
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar1; psVar8 = psVar8 + 1)
    {
      sVar2 = psVar8->_M_len;
      sVar9 = *psVar8;
      if ((sVar2 != alias._M_len) ||
         ((sVar2 != 0 && (iVar4 = bcmp(psVar8->_M_str,alias._M_str,sVar2), iVar4 != 0)))) {
        alias_10._M_str =
             *(char **)((long)_Var5.
                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ._M_cur + 8);
        alias_10._M_len =
             *(size_t *)
              ((long)_Var5.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur + 0x10);
        addPublicationAlias(this,sVar9,alias_10);
        alias_11._M_str =
             *(char **)((long)_Var5.
                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ._M_cur + 8);
        alias_11._M_len =
             *(size_t *)
              ((long)_Var5.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur + 0x10);
        addInputAlias(this,*psVar8,alias_11);
        alias_12._M_str =
             *(char **)((long)_Var5.
                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ._M_cur + 8);
        alias_12._M_len =
             *(size_t *)
              ((long)_Var5.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur + 0x10);
        addEndpointAlias(this,*psVar8,alias_12);
        alias_13._M_str =
             *(char **)((long)_Var5.
                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ._M_cur + 8);
        alias_13._M_len =
             *(size_t *)
              ((long)_Var5.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur + 0x10);
        addFilterAlias(this,*psVar8,alias_13);
      }
    }
  }
  interfaceName_05._M_str =
       *(char **)((long)_Var5.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_05._M_len =
       *(size_t *)
        ((long)_Var5.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_14._M_str =
       *(char **)((long)_Var6.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_14._M_len =
       *(size_t *)
        ((long)_Var6.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  addPublicationAlias(this,interfaceName_05,alias_14);
  interfaceName_06._M_str =
       *(char **)((long)_Var5.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_06._M_len =
       *(size_t *)
        ((long)_Var5.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_15._M_str =
       *(char **)((long)_Var6.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_15._M_len =
       *(size_t *)
        ((long)_Var6.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  addInputAlias(this,interfaceName_06,alias_15);
  interfaceName_07._M_str =
       *(char **)((long)_Var5.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_07._M_len =
       *(size_t *)
        ((long)_Var5.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_16._M_str =
       *(char **)((long)_Var6.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_16._M_len =
       *(size_t *)
        ((long)_Var6.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  addEndpointAlias(this,interfaceName_07,alias_16);
  interfaceName_08._M_str =
       *(char **)((long)_Var5.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_08._M_len =
       *(size_t *)
        ((long)_Var5.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_17._M_str =
       *(char **)((long)_Var6.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_17._M_len =
       *(size_t *)
        ((long)_Var6.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  addFilterAlias(this,interfaceName_08,alias_17);
  return;
}

Assistant:

void HandleManager::addAlias(std::string_view interfaceName, std::string_view alias)
{
    // interfaceName needs to be stable to emplace here so we create a stable string in the aliases
    // map
    auto [aliasName, existing1] = alias_names.emplace(alias);
    auto [iName, existing2] = alias_names.emplace(interfaceName);
    const std::string& aliasStableName = *aliasName;
    const std::string& interfaceStableName = *iName;

    bool cascade = addAliasName(interfaceStableName, aliasStableName);

    if (cascade) {
        auto& aliasRange = aliases[interfaceStableName];
        for (auto& interfaceAlias : aliasRange) {
            if (interfaceAlias != alias) {
                addPublicationAlias(interfaceAlias, interfaceStableName);
                addInputAlias(interfaceAlias, interfaceStableName);
                addEndpointAlias(interfaceAlias, interfaceStableName);
                addFilterAlias(interfaceAlias, interfaceStableName);
            }
        }
    }

    // add aliases for existing interfaces
    addPublicationAlias(*iName, *aliasName);
    addInputAlias(*iName, *aliasName);
    addEndpointAlias(*iName, *aliasName);
    addFilterAlias(*iName, *aliasName);

    /** aliases should be reciprocal*/
    cascade = addAliasName(aliasStableName, interfaceStableName);

    if (cascade) {
        auto& aliasRange = aliases[aliasStableName];
        for (auto& interfaceAlias : aliasRange) {
            if (interfaceAlias != alias) {
                addPublicationAlias(interfaceAlias, aliasStableName);
                addInputAlias(interfaceAlias, aliasStableName);
                addEndpointAlias(interfaceAlias, aliasStableName);
                addFilterAlias(interfaceAlias, aliasStableName);
            }
        }
    }

    // add aliases for existing interfaces
    addPublicationAlias(*aliasName, *iName);
    addInputAlias(*aliasName, *iName);
    addEndpointAlias(*aliasName, *iName);
    addFilterAlias(*aliasName, *iName);
}